

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidatePushCData(xmlRelaxNGValidCtxtPtr ctxt,xmlChar *data,int len)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((ctxt != (xmlRelaxNGValidCtxtPtr)0x0) &&
     (data != (xmlChar *)0x0 && ctxt->elem != (xmlRegExecCtxtPtr)0x0)) {
    for (; uVar2 = (ulong)*data, uVar2 < 0x21; data = data + 1) {
      if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0) goto LAB_00179831;
        break;
      }
    }
    iVar1 = xmlRegExecPushString(ctxt->elem,(xmlChar *)"#text",ctxt);
    if (iVar1 < 0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_TEXTWRONG,(xmlChar *)" TODO ",(xmlChar *)0x0,0);
    }
    else {
LAB_00179831:
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
xmlRelaxNGValidatePushCData(xmlRelaxNGValidCtxtPtr ctxt,
                            const xmlChar * data, int len ATTRIBUTE_UNUSED)
{
    int ret = 1;

    if ((ctxt == NULL) || (ctxt->elem == NULL) || (data == NULL))
        return (-1);

    while (*data != 0) {
        if (!IS_BLANK_CH(*data))
            break;
        data++;
    }
    if (*data == 0)
        return (1);

    ret = xmlRegExecPushString(ctxt->elem, BAD_CAST "#text", ctxt);
    if (ret < 0) {
        VALID_ERR2(XML_RELAXNG_ERR_TEXTWRONG, BAD_CAST " TODO ");

        return (-1);
    }
    return (1);
}